

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_0::AsyncStreamFd::getsockname
          (AsyncStreamFd *this,int __fd,sockaddr *__addr,socklen_t *__len)

{
  int iVar1;
  undefined4 in_register_00000034;
  socklen_t socklen;
  Fault f;
  socklen_t local_2c;
  Fault local_28;
  
  local_2c._0_2_ = __addr->sa_family;
  local_2c._2_1_ = __addr->sa_data[0];
  local_2c._3_1_ = __addr->sa_data[1];
  do {
    iVar1 = ::getsockname((this->super_OwnedFileDescriptor).fd,
                          (sockaddr *)CONCAT44(in_register_00000034,__fd),&local_2c);
    if (-1 < iVar1) goto LAB_0038b6fa;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x1ff,iVar1,"::getsockname(fd, addr, &socklen)","");
    kj::_::Debug::Fault::fatal(&local_28);
  }
LAB_0038b6fa:
  __addr->sa_family = (undefined2)local_2c;
  __addr->sa_data[0] = local_2c._2_1_;
  __addr->sa_data[1] = local_2c._3_1_;
  return local_2c;
}

Assistant:

void getsockname(struct sockaddr* addr, uint* length) override {
    socklen_t socklen = *length;
    KJ_SYSCALL(::getsockname(fd, addr, &socklen));
    *length = socklen;
  }